

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::genVertexArrays(ReferenceContext *this,int numArrays,deUint32 *vertexArrays)

{
  deUint32 dVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (vertexArrays == (deUint32 *)0x0) {
    if (this->m_lastError == 0) {
      this->m_lastError = 0x501;
    }
  }
  else {
    uVar2 = 0;
    uVar3 = (ulong)(uint)numArrays;
    if (numArrays < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      dVar1 = rc::ObjectManager<sglr::rc::VertexArray>::allocateName(&this->m_vertexArrays);
      vertexArrays[uVar2] = dVar1;
    }
  }
  return;
}

Assistant:

void ReferenceContext::genVertexArrays (int numArrays, deUint32* vertexArrays)
{
	RC_IF_ERROR(!vertexArrays, GL_INVALID_VALUE, RC_RET_VOID);

	for (int ndx = 0; ndx < numArrays; ndx++)
		vertexArrays[ndx] = m_vertexArrays.allocateName();
}